

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.cc
# Opt level: O1

double Minisat::memUsedPeak(bool strictlyPeak)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  double dVar3;
  int peak_kb;
  char name [256];
  int local_12c;
  char local_128 [264];
  
  uVar1 = getpid();
  sprintf(local_128,"/proc/%d/status",(ulong)uVar1);
  __stream = fopen(local_128,"rb");
  dVar3 = 0.0;
  if (__stream != (FILE *)0x0) {
    local_12c = 0;
    iVar2 = feof(__stream);
    if (iVar2 == 0) {
      do {
        iVar2 = __isoc99_fscanf(__stream,"VmPeak: %d kB",&local_12c);
        if (iVar2 == 1) break;
        do {
          iVar2 = feof(__stream);
          if (iVar2 != 0) break;
          iVar2 = fgetc(__stream);
        } while (iVar2 != 10);
        iVar2 = feof(__stream);
      } while (iVar2 == 0);
    }
    fclose(__stream);
    dVar3 = (double)local_12c * 0.0009765625;
  }
  if (dVar3 == 0.0 && !strictlyPeak) {
    dVar3 = memUsed();
  }
  return dVar3;
}

Assistant:

double Minisat::memUsedPeak(bool strictlyPeak) { 
    double peak = memReadPeak() / (double)1024;
    return peak == 0 && !strictlyPeak ? memUsed() : peak; }